

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O2

int Mig_ManSuppSizeTest(Mig_Man_t *p)

{
  int iVar1;
  abctime aVar2;
  Mig_Obj_t *pObj;
  abctime aVar3;
  uint uVar4;
  
  aVar2 = Abc_Clock();
  uVar4 = 0;
  iVar1 = 0;
  while (p->iPage = iVar1, iVar1 < (p->vPages).nSize) {
    pObj = (Mig_Obj_t *)Vec_PtrEntry(&p->vPages,iVar1);
    p->pPage = pObj;
    if (pObj == (Mig_Obj_t *)0x0) break;
    for (; (uint)pObj->pFans[3] < 0xfffffffe; pObj = pObj + 1) {
      if ((uint)pObj->pFans[1] < 0xfffffffe) {
        iVar1 = Mig_ManSuppSizeOne(pObj);
        uVar4 = uVar4 + (iVar1 < 0x11);
      }
    }
    iVar1 = p->iPage + 1;
  }
  iVar1 = 0x7e4dd1;
  printf("Nodes with small support %d (out of %d)\n",(ulong)uVar4,
         (ulong)(uint)(~((p->vCos).nSize + (p->vCis).nSize) + p->nObjs));
  aVar3 = Abc_Clock();
  Abc_Print(iVar1,"%s =","Time");
  Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  return uVar4;
}

Assistant:

int Mig_ManSuppSizeTest( Mig_Man_t * p )
{
    Mig_Obj_t * pObj;
    int Counter = 0;
    abctime clk = Abc_Clock();
    Mig_ManForEachObj( p, pObj )
        if ( Mig_ObjIsNode(pObj) )
            Counter += (Mig_ManSuppSizeOne(pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Mig_ManNodeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;
}